

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O0

void __thiscall
bgui::ImageWindow::visibleImagePart(ImageWindow *this,long *x,long *y,long *w,long *h)

{
  int *piVar1;
  long *plVar2;
  long lVar3;
  SVector<long,_3> *a;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  SMatrix<long,_2,_3> *in_RDI;
  long *in_R8;
  double dVar4;
  SVector<long,_2> p2;
  SVector<long,_2> p1;
  SVector<long,_3> q2;
  SVector<long,_3> q1;
  double scale;
  int hh;
  int ww;
  int *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  BaseWindow *in_stack_fffffffffffffef0;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  SVector<long,_2> local_b0;
  SVector<long,_2> local_a0;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  int local_70 [2];
  SVector<long,_3> local_68;
  SVector<long,_3> local_50;
  double local_38;
  int local_30;
  int local_2c;
  long *local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  
  if (in_RDI->v[0][2] == 0) {
    *in_RDX = 0;
    *in_RSI = 0;
    *in_R8 = -1;
    *in_RCX = -1;
  }
  else {
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    BaseWindow::getSize(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                        in_stack_fffffffffffffee0);
    local_38 = ImageAdapterBase::getScale((ImageAdapterBase *)in_RDI->v[0][2]);
    gmath::SVector<long,_3>::SVector(&local_50);
    gmath::SVector<long,_3>::SVector(&local_68);
    local_70[1] = 0;
    piVar1 = std::max<int>((int *)((long)in_RDI[1].v[0] + 0x14),local_70 + 1);
    dVar4 = (double)*piVar1 / local_38;
    plVar2 = gmath::SVector<long,_3>::operator[](&local_50,0);
    *plVar2 = (long)dVar4;
    local_70[0] = 0;
    piVar1 = std::max<int>((int *)(in_RDI[1].v + 1),local_70);
    lVar3 = (long)((double)*piVar1 / local_38);
    plVar2 = gmath::SVector<long,_3>::operator[](&local_50,1);
    *plVar2 = lVar3;
    plVar2 = gmath::SVector<long,_3>::operator[](&local_50,2);
    *plVar2 = 1;
    plVar2 = gmath::SVector<long,_3>::operator[](&local_50,0);
    lVar3 = *plVar2;
    local_78 = (long)local_2c;
    local_80 = (**(code **)(*(long *)in_RDI->v[0][2] + 0x58))();
    plVar2 = std::min<long>(&local_78,&local_80);
    lVar3 = lVar3 + (long)((double)*plVar2 / local_38);
    plVar2 = gmath::SVector<long,_3>::operator[](&local_68,0);
    *plVar2 = lVar3;
    plVar2 = gmath::SVector<long,_3>::operator[](&local_50,1);
    lVar3 = *plVar2;
    local_88 = (long)local_30;
    local_90 = (**(code **)(*(long *)in_RDI->v[0][2] + 0x60))();
    plVar2 = std::min<long>(&local_88,&local_90);
    a = (SVector<long,_3> *)(lVar3 + (long)((double)*plVar2 / local_38));
    plVar2 = gmath::SVector<long,_3>::operator[](&local_68,1);
    *plVar2 = (long)a;
    plVar2 = gmath::SVector<long,_3>::operator[](&local_68,2);
    *plVar2 = 1;
    ImageAdapterBase::getRotationMatrix((ImageAdapterBase *)in_RDI->v[0][2]);
    gmath::SMatrix<long,_2,_3>::operator*(in_RDI,a);
    ImageAdapterBase::getRotationMatrix((ImageAdapterBase *)in_RDI->v[0][2]);
    gmath::SMatrix<long,_2,_3>::operator*(in_RDI,a);
    local_b8 = gmath::SVector<long,_2>::operator[](&local_a0,0);
    local_c0 = gmath::SVector<long,_2>::operator[](&local_b0,0);
    plVar2 = std::min<long>(&local_b8,&local_c0);
    *local_10 = *plVar2;
    local_c8 = gmath::SVector<long,_2>::operator[](&local_a0,1);
    local_d0 = gmath::SVector<long,_2>::operator[](&local_b0,1);
    plVar2 = std::min<long>(&local_c8,&local_d0);
    *local_18 = *plVar2;
    local_d8 = gmath::SVector<long,_2>::operator[](&local_a0,0);
    local_e0 = gmath::SVector<long,_2>::operator[](&local_b0,0);
    plVar2 = std::max<long>(&local_d8,&local_e0);
    *local_20 = *plVar2 - *local_10;
    local_e8 = gmath::SVector<long,_2>::operator[](&local_a0,1);
    local_f0 = gmath::SVector<long,_2>::operator[](&local_b0,1);
    plVar2 = std::max<long>(&local_e8,&local_f0);
    *local_28 = *plVar2 - *local_18;
  }
  return;
}

Assistant:

void ImageWindow::visibleImagePart(long &x, long &y, long &w, long &h)
{
  if (adapt != 0)
  {
    int ww, hh;
    getSize(ww, hh);

    double scale=adapt->getScale();

    gmath::SVector<long, 3> q1, q2;

    q1[0]=static_cast<long>(std::max(imx, 0)/scale);
    q1[1]=static_cast<long>(std::max(imy, 0)/scale);
    q1[2]=1;

    q2[0]=q1[0]+static_cast<long>(std::min(static_cast<long>(ww), adapt->getWidth())/scale);
    q2[1]=q1[1]+static_cast<long>(std::min(static_cast<long>(hh), adapt->getHeight())/scale);
    q2[2]=1;

    const gmath::SVector<long, 2> p1=adapt->getRotationMatrix()*q1;
    const gmath::SVector<long, 2> p2=adapt->getRotationMatrix()*q2;

    x=std::min(p1[0], p2[0]);
    y=std::min(p1[1], p2[1]);
    w=std::max(p1[0], p2[0])-x;
    h=std::max(p1[1], p2[1])-y;
  }
  else
  {
    x=y=0;
    w=h=-1;
  }
}